

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_Uniform.h
# Opt level: O2

int __thiscall
Nova::Boundary_Uniform<float,_1>::Boundary_Side
          (Boundary_Uniform<float,_1> *this,int side,Range<int,_1> *region)

{
  int *piVar1;
  
  piVar1 = Vector<int,_1,_true>::operator[]
                     ((Vector<int,_1,_true> *)
                      ((long)(region->min_corner)._data._M_elems + (ulong)((side & 1U) * 4 ^ 4)),
                      side / 2);
  return (-(side & 1U) | 1) + *piVar1;
}

Assistant:

int Boundary_Side(const int side,const Range<int,d>& region) const
    {int axis=side/2;return (side%2==0)?region.max_corner[axis]+1:region.min_corner[axis]-1;}